

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O2

int Lpk_NodeCutsCheckDsd(Lpk_Man_t *p,Lpk_Cut_t *pCut)

{
  int *__s;
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  
  if ((*(uint *)pCut & 0x3f) == 0) {
    __assert_fail("pCut->nLeaves > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                  ,0x117,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
  }
  __s = p->pRefs;
  memset(__s,0,(ulong)((*(uint *)pCut & 0x3f) << 2));
  for (pAVar7 = (Abc_Obj_t *)0x0; uVar4 = *(uint *)pCut, pAVar7 < (Abc_Obj_t *)(ulong)(uVar4 & 0x3f)
      ; pAVar7 = (Abc_Obj_t *)((long)&pAVar7->pNtk + 1)) {
    pAVar6 = Abc_NtkObj(p->pNtk,pCut->pLeaves[(long)pAVar7]);
    if ((*(uint *)&pAVar6->field_0x14 & 0x10) != 0) {
      __assert_fail("pObj->fMarkA == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                    ,0x11d,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
    }
    *(uint *)&pAVar6->field_0x14 = *(uint *)&pAVar6->field_0x14 | 0x10;
    (pAVar6->field_6).pCopy = pAVar7;
  }
  uVar12 = 0;
  for (uVar11 = 0; uVar11 < (uVar4 >> 6 & 0x3f); uVar11 = uVar11 + 1) {
    pAVar7 = Abc_NtkObj(p->pNtk,pCut->pNodes[uVar11]);
    bVar2 = true;
    for (lVar8 = 0; lVar8 < (pAVar7->vFanins).nSize; lVar8 = lVar8 + 1) {
      pvVar1 = pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar8]];
      bVar3 = false;
      if ((*(byte *)((long)pvVar1 + 0x14) & 0x10) != 0) {
        __s[*(int *)((long)pvVar1 + 0x40)] = __s[*(int *)((long)pvVar1 + 0x40)] + 1;
        bVar3 = bVar2;
      }
      bVar2 = bVar3;
    }
    if (bVar2) {
      lVar8 = (long)(int)uVar12;
      uVar12 = uVar12 + 1;
      p->pCands[lVar8] = pAVar7->Id;
    }
    uVar4 = *(uint *)pCut;
  }
  iVar5 = 0;
  if ((int)uVar12 < 1) {
    uVar12 = 0;
  }
  uVar11 = 0;
  do {
    if (uVar11 == uVar12) goto LAB_003d0ebd;
    pAVar7 = Abc_NtkObj(p->pNtk,p->pCands[uVar11]);
    uVar4 = (pAVar7->vFanins).nSize;
    uVar9 = 0;
    if (0 < (int)uVar4) {
      uVar9 = (ulong)uVar4;
    }
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      pvVar1 = pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[uVar10]];
      if ((*(byte *)((long)pvVar1 + 0x14) & 0x10) == 0) {
        __assert_fail("pFanin->fMarkA == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                      ,0x135,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
      }
      if (1 < __s[*(int *)((long)pvVar1 + 0x40)]) {
        uVar9 = uVar10 & 0xffffffff;
        break;
      }
    }
    uVar11 = uVar11 + 1;
  } while ((uint)uVar9 != uVar4);
  iVar5 = 1;
LAB_003d0ebd:
  for (uVar11 = 0; uVar11 < (*(uint *)pCut & 0x3f); uVar11 = uVar11 + 1) {
    pAVar7 = Abc_NtkObj(p->pNtk,pCut->pLeaves[uVar11]);
    pAVar7->field_0x14 = pAVar7->field_0x14 & 0xef;
  }
  return iVar5;
}

Assistant:

int Lpk_NodeCutsCheckDsd( Lpk_Man_t * p, Lpk_Cut_t * pCut )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nCands, fLeavesOnly, RetValue;
    assert( pCut->nLeaves > 0 );
    // clear ref counters
    memset( p->pRefs, 0, sizeof(int) * pCut->nLeaves );
    // mark cut leaves
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
    {
        assert( pObj->fMarkA == 0 );
        pObj->fMarkA = 1;
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;
    }
    // ref leaves pointed from the internal nodes
    nCands = 0;
    Lpk_CutForEachNode( p->pNtk, pCut, pObj, i )
    {
        fLeavesOnly = 1;
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pFanin->fMarkA )
                p->pRefs[(int)(ABC_PTRUINT_T)pFanin->pCopy]++;
            else
                fLeavesOnly = 0;
        if ( fLeavesOnly )
            p->pCands[nCands++] = pObj->Id;
    }
    // look at the nodes that only point to the leaves
    RetValue = 0;
    for ( i = 0; i < nCands; i++ )
    {
        pObj = Abc_NtkObj( p->pNtk, p->pCands[i] );
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            assert( pFanin->fMarkA == 1 );
            if ( p->pRefs[(int)(ABC_PTRUINT_T)pFanin->pCopy] > 1 )
                break;
        }
        if ( k == Abc_ObjFaninNum(pObj) )
        {
            RetValue = 1;
            break;
        }
    }
    // unmark cut leaves
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
        pObj->fMarkA = 0;
    return RetValue;
}